

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep_test.c
# Opt level: O1

void test_rep_double_recv(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  nng_aio *local_40;
  nng_aio *aio1;
  nng_aio *aio2;
  nng_socket s1;
  
  nVar1 = nng_rep0_open((nng_socket *)((long)&aio2 + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0xa2,"%s: expected success, got %s (%d)","nng_rep0_open(&s1)",pcVar3,nVar1
                        );
  if (iVar2 != 0) {
    nVar1 = nng_aio_alloc(&local_40,(_func_void_void_ptr *)0x0,(void *)0x0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                           ,0xa3,"%s: expected success, got %s (%d)",
                           "nng_aio_alloc(&aio1, NULL, NULL)",pcVar3,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_aio_alloc(&aio1,(_func_void_void_ptr *)0x0,(void *)0x0);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                             ,0xa4,"%s: expected success, got %s (%d)",
                             "nng_aio_alloc(&aio2, NULL, NULL)",pcVar3,nVar1);
      if (iVar2 != 0) {
        nng_socket_recv(aio2._4_4_,local_40);
        nng_socket_recv(aio2._4_4_,aio1);
        nng_aio_wait(aio1);
        nVar1 = nng_aio_result(aio1);
        pcVar3 = nng_strerror(NNG_ESTATE);
        acutest_check_((uint)(nVar1 == NNG_ESTATE),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                       ,0xaa,"%s fails with %s","nng_aio_result(aio2)",pcVar3);
        pcVar3 = nng_strerror(NNG_ESTATE);
        pcVar4 = nng_strerror(nVar1);
        acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio2)",pcVar3,0xb,
                         pcVar4,(ulong)nVar1);
        nVar1 = nng_socket_close(aio2._4_4_);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                               ,0xab,"%s: expected success, got %s (%d)","nng_socket_close(s1)",
                               pcVar3,nVar1);
        if (iVar2 != 0) {
          nng_aio_wait(local_40);
          num = nng_aio_result(local_40);
          pcVar3 = nng_strerror(NNG_ECLOSED);
          acutest_check_((uint)(num == NNG_ECLOSED),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/rep_test.c"
                         ,0xad,"%s fails with %s","nng_aio_result(aio1)",pcVar3,nVar1);
          pcVar3 = nng_strerror(NNG_ECLOSED);
          pcVar4 = nng_strerror(num);
          acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio1)",pcVar3,7,
                           pcVar4,(ulong)num);
          nng_aio_free(local_40);
          nng_aio_free(aio1);
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_rep_double_recv(void)
{
	nng_socket s1;
	nng_aio   *aio1;
	nng_aio   *aio2;

	NUTS_PASS(nng_rep0_open(&s1));
	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio2, NULL, NULL));

	nng_socket_recv(s1, aio1);
	nng_socket_recv(s1, aio2);

	nng_aio_wait(aio2);
	NUTS_FAIL(nng_aio_result(aio2), NNG_ESTATE);
	NUTS_CLOSE(s1);
	nng_aio_wait(aio1);
	NUTS_FAIL(nng_aio_result(aio1), NNG_ECLOSED);
	nng_aio_free(aio1);
	nng_aio_free(aio2);
}